

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_wrapper_j(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  
  uVar1 = node->type_properties;
  if ((~uVar1 & 0x401) == 0) {
    node->type_properties = ((uVar1 & 0x4000) >> 1) + (uVar1 & 0x1920f) + 0x20c00;
    return 0;
  }
  return -2;
}

Assistant:

static int verify_miniscript_wrapper_j(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    uint32_t need_type = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_N;
    (void)parent;

    if ((x_prop & need_type) != need_type)
        return WALLY_EINVAL;

    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_O |
                             MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_M |
                             MINISCRIPT_PROPERTY_S;
    node->type_properties |= MINISCRIPT_PROPERTY_N | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_X;
    if (x_prop & MINISCRIPT_PROPERTY_F) {
        node->type_properties &= ~MINISCRIPT_PROPERTY_F;
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    }
    return WALLY_OK;
}